

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiComponentRDF.cpp
# Opt level: O3

void __thiscall
OpenMD::MultiComponentRDF::processOverlapping
          (MultiComponentRDF *this,SelectionManager *sman,int pairIndex)

{
  undefined8 in_RAX;
  StuntDouble *pSVar1;
  StuntDouble *pSVar2;
  int i;
  int j;
  undefined8 local_38;
  
  local_38 = in_RAX;
  pSVar1 = SelectionManager::beginSelected(sman,(int *)&local_38);
  if (pSVar1 != (StuntDouble *)0x0) {
    do {
      local_38 = CONCAT44((int)local_38,(int)local_38);
      while( true ) {
        pSVar2 = SelectionManager::nextSelected(sman,(int *)((long)&local_38 + 4));
        if (pSVar2 == (StuntDouble *)0x0) break;
        (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[9])
                  (this,pSVar1,pSVar2,(ulong)(uint)pairIndex);
      }
      pSVar1 = SelectionManager::nextSelected(sman,(int *)&local_38);
    } while (pSVar1 != (StuntDouble *)0x0);
  }
  return;
}

Assistant:

void MultiComponentRDF::processOverlapping(SelectionManager& sman,
                                             int pairIndex) {
    StuntDouble* sd1;
    StuntDouble* sd2;
    int i;
    int j;

    // This is the same as a pairwise loop structure:
    // for (int i = 0;  i < n-1 ; ++i ) {
    //   for (int j = i + 1; j < n; ++j) {}
    // }

    for (sd1 = sman.beginSelected(i); sd1 != NULL; sd1 = sman.nextSelected(i)) {
      for (j = i, sd2 = sman.nextSelected(j); sd2 != NULL;
           sd2 = sman.nextSelected(j)) {
        collectHistograms(sd1, sd2, pairIndex);
      }
    }
  }